

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O3

void __thiscall
Catch::Capturer::captureValues<char[8],unsigned_int>
          (Capturer *this,size_t index,char (*value) [8],uint *values)

{
  void *pvVar1;
  uint *puVar2;
  char *pcVar3;
  StringRef string;
  string local_48;
  
  puVar2 = values;
  pvVar1 = memchr(value,0,8);
  pcVar3 = (char *)((long)pvVar1 - (long)value);
  if (pvVar1 == (void *)0x0) {
    pcVar3 = (char *)0x8;
  }
  string.m_size = (size_type)puVar2;
  string.m_start = pcVar3;
  Detail::convertIntoString_abi_cxx11_(&local_48,(Detail *)value,string);
  captureValue(this,index,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  captureValues<unsigned_int>(this,index + 1,values);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }